

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

reference __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
::emplace_back<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>
          (InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
           *this,QueueEntry *args)

{
  ulong uVar1;
  double dVar2;
  reference pQVar3;
  ulong uVar4;
  long lVar5;
  Rep *pRVar6;
  ulong uVar7;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  uVar4 = uVar1 >> 1;
  if ((uVar1 & 1) == 0) {
    uVar7 = 0x10;
  }
  else {
    uVar7 = *(ulong *)&this->rep_;
  }
  pRVar6 = &this->rep_;
  if (uVar7 < uVar4) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>]"
                 );
  }
  if (uVar4 == uVar7) {
    pQVar3 = GrowAndEmplaceBack<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>(this,args);
    return pQVar3;
  }
  if (uVar4 < uVar7) {
    if ((uVar1 & 1) != 0) {
      pRVar6 = *(Rep **)((long)&this->rep_ + 8);
    }
    (this->allocator_and_tag_).tag_.size_ = uVar1 + 2;
    lVar5 = uVar4 * 0x18;
    *(S2ShapeIndexCell **)((long)pRVar6 + lVar5 + 0x10) = args->index_cell;
    dVar2 = (double)(args->id).id_;
    *(double *)((long)pRVar6 + lVar5) = (args->distance).distance_.length2_;
    ((double *)((long)pRVar6 + lVar5))[1] = dVar2;
    return (reference)((long)pRVar6 + lVar5);
  }
  __assert_fail("s < capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x21b,
                "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>]"
               );
}

Assistant:

reference emplace_back(Args&&... args) {
    size_type s = size();
    assert(s <= capacity());
    if (ABSL_PREDICT_FALSE(s == capacity())) {
      return GrowAndEmplaceBack(std::forward<Args>(args)...);
    }
    assert(s < capacity());

    pointer space;
    if (allocated()) {
      tag().set_allocated_size(s + 1);
      space = allocated_space();
    } else {
      tag().set_inline_size(s + 1);
      space = inlined_space();
    }
    return Construct(space + s, std::forward<Args>(args)...);
  }